

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi_p.h
# Opt level: O0

void __thiscall
QRhiImplementation::addCleanupCallback(QRhiImplementation *this,void *key,CleanupCallback *callback)

{
  long lVar1;
  function<void_(QRhi_*)> *in_RDX;
  QHash<const_void_*,_std::function<void_(QRhi_*)>_> *in_RSI;
  function<void_(QRhi_*)> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<const_void_*,_std::function<void_(QRhi_*)>_>::operator[](in_RSI,(void **)in_RDI);
  std::function<void_(QRhi_*)>::operator=(in_RDI,in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addCleanupCallback(const void *key, const QRhi::CleanupCallback &callback)
    {
        keyedCleanupCallbacks[key] = callback;
    }